

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

int32_t __thiscall
wasm::Match::Internal::GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0>
::operator()(GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0> *this,
            Literal *lit)

{
  int32_t iVar1;
  Literal local_28;
  
  Literal::Literal(&local_28,lit);
  iVar1 = Literal::geti32(&local_28);
  Literal::~Literal(&local_28);
  return iVar1;
}

Assistant:

decltype(auto) operator()(Literal lit) { return T::getVal(lit); }